

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_array_toString(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  ushort uVar1;
  int iVar2;
  JSRefCountHeader *p;
  uint argc_00;
  uint uVar3;
  JSValueUnion argv_00;
  ulong uVar4;
  JSValueUnion JVar5;
  int64_t iVar6;
  JSRefCountHeader *p_1;
  byte bVar7;
  JSValue JVar8;
  JSValue v;
  JSValue JVar9;
  
  JVar8 = JS_ToObject(ctx,this_val);
  if ((uint)JVar8.tag == 6) {
    iVar6 = 6;
    JVar5.float64 = 0.0;
    goto LAB_00162d2d;
  }
  JVar9 = JVar8;
  v = JS_GetPropertyInternal(ctx,JVar8,0x5b,JVar8,0);
  argv_00 = JVar9.u;
  JVar5 = v.u;
  uVar3 = (uint)v.tag;
  if ((v.tag & 0xffffffffU) == 6) {
    JVar9 = (JSValue)(ZEXT816(6) << 0x40);
    uVar4 = 0;
  }
  else {
    argc_00 = uVar3;
    if (uVar3 == 0xffffffff) {
      uVar1 = *(ushort *)((long)JVar5.ptr + 6);
      if (uVar1 != 0xd) {
        if (uVar1 == 0x29) {
          bVar7 = *(byte *)(*(long *)((long)JVar5.ptr + 0x30) + 0x20);
        }
        else {
          bVar7 = ctx->rt->class_array[uVar1].call != (JSClassCall *)0x0;
        }
        argc_00 = (uint)bVar7;
        if (argc_00 == 0) goto LAB_00162cd1;
      }
      JVar9 = JS_CallFree(ctx,v,JVar8,0,(JSValue *)0x0);
    }
    else {
LAB_00162cd1:
      if (0xfffffff4 < uVar3) {
        argc_00 = *JVar5.ptr;
        *(uint *)JVar5.ptr = argc_00 - 1;
        if ((int)argc_00 < 2) {
          __JS_FreeValueRT(ctx->rt,v);
        }
      }
      JVar9 = js_object_toString(ctx,JVar8,argc_00,(JSValue *)argv_00.ptr);
    }
    uVar4 = (ulong)JVar9.u.ptr & 0xffffffff00000000;
  }
  iVar6 = JVar9.tag;
  if ((0xfffffff4 < (uint)JVar8.tag) &&
     (iVar2 = *JVar8.u.ptr, *(int *)JVar8.u.ptr = iVar2 + -1, iVar2 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar8);
  }
  JVar5.ptr = (void *)(uVar4 | (ulong)JVar9.u.ptr & 0xffffffff);
LAB_00162d2d:
  JVar8.tag = iVar6;
  JVar8.u.float64 = JVar5.float64;
  return JVar8;
}

Assistant:

static JSValue js_array_toString(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv)
{
    JSValue obj, method, ret;

    obj = JS_ToObject(ctx, this_val);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    method = JS_GetProperty(ctx, obj, JS_ATOM_join);
    if (JS_IsException(method)) {
        ret = JS_EXCEPTION;
    } else
    if (!JS_IsFunction(ctx, method)) {
        /* Use intrinsic Object.prototype.toString */
        JS_FreeValue(ctx, method);
        ret = js_object_toString(ctx, obj, 0, NULL);
    } else {
        ret = JS_CallFree(ctx, method, obj, 0, NULL);
    }
    JS_FreeValue(ctx, obj);
    return ret;
}